

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

SUNLinearSolver SUNLinSol_SPGMR(N_Vector y,int pretype,int maxl,SUNContext sunctx)

{
  N_Vector_Ops p_Var1;
  SUNLinearSolver_Ops p_Var2;
  SUNLinearSolver S;
  int *piVar3;
  N_Vector p_Var4;
  int iVar5;
  
  if (3 < (uint)pretype) {
    pretype = 0;
  }
  iVar5 = 5;
  if (0 < maxl) {
    iVar5 = maxl;
  }
  p_Var1 = y->ops;
  if ((((((p_Var1->nvclone != (_func_N_Vector_N_Vector *)0x0) &&
         (p_Var1->nvdestroy != (_func_void_N_Vector *)0x0)) &&
        (p_Var1->nvlinearsum != (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) &&
       ((p_Var1->nvconst != (_func_void_realtype_N_Vector *)0x0 &&
        (p_Var1->nvprod != (_func_void_N_Vector_N_Vector_N_Vector *)0x0)))) &&
      ((p_Var1->nvdiv != (_func_void_N_Vector_N_Vector_N_Vector *)0x0 &&
       ((p_Var1->nvscale != (_func_void_realtype_N_Vector_N_Vector *)0x0 &&
        (p_Var1->nvdotprod != (_func_realtype_N_Vector_N_Vector *)0x0)))))) &&
     (S = SUNLinSolNewEmpty(sunctx), S != (SUNLinearSolver)0x0)) {
    p_Var2 = S->ops;
    p_Var2->gettype = SUNLinSolGetType_SPGMR;
    p_Var2->getid = SUNLinSolGetID_SPGMR;
    p_Var2->setatimes = SUNLinSolSetATimes_SPGMR;
    p_Var2->setpreconditioner = SUNLinSolSetPreconditioner_SPGMR;
    p_Var2->setscalingvectors = SUNLinSolSetScalingVectors_SPGMR;
    p_Var2->setzeroguess = SUNLinSolSetZeroGuess_SPGMR;
    p_Var2->initialize = SUNLinSolInitialize_SPGMR;
    p_Var2->setup = SUNLinSolSetup_SPGMR;
    p_Var2->solve = SUNLinSolSolve_SPGMR;
    p_Var2->numiters = SUNLinSolNumIters_SPGMR;
    p_Var2->resnorm = SUNLinSolResNorm_SPGMR;
    p_Var2->resid = SUNLinSolResid_SPGMR;
    p_Var2->lastflag = SUNLinSolLastFlag_SPGMR;
    p_Var2->space = SUNLinSolSpace_SPGMR;
    p_Var2->free = SUNLinSolFree_SPGMR;
    piVar3 = (int *)malloc(0xb0);
    if (piVar3 != (int *)0x0) {
      S->content = piVar3;
      *piVar3 = iVar5;
      piVar3[1] = pretype;
      piVar3[2] = 1;
      piVar3[3] = 0;
      piVar3[4] = 0;
      piVar3[5] = 0;
      piVar3[6] = 0;
      piVar3[7] = 0;
      piVar3[8] = 0;
      piVar3[10] = 0;
      piVar3[0xb] = 0;
      piVar3[0xc] = 0;
      piVar3[0xd] = 0;
      piVar3[0xe] = 0;
      piVar3[0xf] = 0;
      piVar3[0x10] = 0;
      piVar3[0x11] = 0;
      piVar3[0x12] = 0;
      piVar3[0x13] = 0;
      piVar3[0x14] = 0;
      piVar3[0x15] = 0;
      piVar3[0x16] = 0;
      piVar3[0x17] = 0;
      piVar3[0x18] = 0;
      piVar3[0x19] = 0;
      piVar3[0x1a] = 0;
      piVar3[0x1b] = 0;
      piVar3[0x1c] = 0;
      piVar3[0x1d] = 0;
      piVar3[0x1e] = 0;
      piVar3[0x1f] = 0;
      piVar3[0x20] = 0;
      piVar3[0x21] = 0;
      piVar3[0x22] = 0;
      piVar3[0x23] = 0;
      piVar3[0x24] = 0;
      piVar3[0x25] = 0;
      piVar3[0x25] = 0;
      piVar3[0x26] = 0;
      piVar3[0x27] = 0;
      piVar3[0x28] = 0;
      *(undefined8 *)(piVar3 + 0x2a) = _stdout;
      p_Var4 = N_VClone(y);
      *(N_Vector *)(piVar3 + 0x1e) = p_Var4;
      if (p_Var4 != (N_Vector)0x0) {
        p_Var4 = N_VClone(y);
        *(N_Vector *)(piVar3 + 0x22) = p_Var4;
        if (p_Var4 != (N_Vector)0x0) {
          return S;
        }
      }
    }
    SUNLinSolFree(S);
  }
  return (SUNLinearSolver)0x0;
}

Assistant:

SUNLinearSolver SUNLinSol_SPGMR(N_Vector y, int pretype, int maxl, SUNContext sunctx)
{
  SUNLinearSolver S;
  SUNLinearSolverContent_SPGMR content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE)  && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
    pretype = SUN_PREC_NONE;
  if (maxl <= 0)
    maxl = SUNSPGMR_MAXL_DEFAULT;

  /* check that the supplied N_Vector supports all requisite operations */
  if ( (y->ops->nvclone == NULL) || (y->ops->nvdestroy == NULL) ||
       (y->ops->nvlinearsum == NULL) || (y->ops->nvconst == NULL) ||
       (y->ops->nvprod == NULL) || (y->ops->nvdiv == NULL) ||
       (y->ops->nvscale == NULL) || (y->ops->nvdotprod == NULL) )
    return(NULL);

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  if (S == NULL) return(NULL);

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_SPGMR;
  S->ops->getid             = SUNLinSolGetID_SPGMR;
  S->ops->setatimes         = SUNLinSolSetATimes_SPGMR;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPGMR;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPGMR;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_SPGMR;
  S->ops->initialize        = SUNLinSolInitialize_SPGMR;
  S->ops->setup             = SUNLinSolSetup_SPGMR;
  S->ops->solve             = SUNLinSolSolve_SPGMR;
  S->ops->numiters          = SUNLinSolNumIters_SPGMR;
  S->ops->resnorm           = SUNLinSolResNorm_SPGMR;
  S->ops->resid             = SUNLinSolResid_SPGMR;
  S->ops->lastflag          = SUNLinSolLastFlag_SPGMR;
  S->ops->space             = SUNLinSolSpace_SPGMR;
  S->ops->free              = SUNLinSolFree_SPGMR;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPGMR) malloc(sizeof *content);
  if (content == NULL) { SUNLinSolFree(S); return(NULL); }

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->last_flag    = 0;
  content->maxl         = maxl;
  content->pretype      = pretype;
  content->gstype       = SUNSPGMR_GSTYPE_DEFAULT;
  content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;
  content->zeroguess    = SUNFALSE;
  content->numiters     = 0;
  content->resnorm      = ZERO;
  content->xcor         = NULL;
  content->vtemp        = NULL;
  content->s1           = NULL;
  content->s2           = NULL;
  content->ATimes       = NULL;
  content->ATData       = NULL;
  content->Psetup       = NULL;
  content->Psolve       = NULL;
  content->PData        = NULL;
  content->V            = NULL;
  content->Hes          = NULL;
  content->givens       = NULL;
  content->yg           = NULL;
  content->cv           = NULL;
  content->Xv           = NULL;
  content->print_level  = 0;
  content->info_file    = stdout;
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  content->info_file    = (sunctx->logger->info_fp) ? sunctx->logger->info_fp : stdout;
#endif

  /* Allocate content */
  content->xcor = N_VClone(y);
  if (content->xcor == NULL) { SUNLinSolFree(S); return(NULL); }

  content->vtemp = N_VClone(y);
  if (content->vtemp == NULL) { SUNLinSolFree(S); return(NULL); }

  return(S);
}